

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join.c
# Opt level: O2

int run_test_udp_multicast_join(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_udp_init(uVar2,&server);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      uVar2 = uv_default_loop();
      iVar1 = uv_udp_init(uVar2,&client);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_udp_bind(&server,&addr,0);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_udp_set_membership(&server,"239.255.0.1",0,1);
          if (iVar1 == -0x13) {
            fprintf(_stderr,"%s\n","No multicast support.");
            fflush(_stderr);
            return 7;
          }
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            iVar1 = uv_udp_recv_start(&server,alloc_cb,cl_recv_cb);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              iVar1 = do_send(&req);
              eval_a = (int64_t)iVar1;
              eval_b = 0;
              if (eval_a == 0) {
                eval_a = (int64_t)close_cb_called;
                eval_b = 0;
                if (eval_a == 0) {
                  eval_a = (int64_t)cl_recv_cb_called;
                  eval_b = 0;
                  if (eval_a == 0) {
                    eval_a = (int64_t)sv_send_cb_called;
                    eval_b = 0;
                    if (eval_a == 0) {
                      uVar2 = uv_default_loop();
                      uv_run(uVar2,0);
                      eval_a = 2;
                      eval_b = (int64_t)cl_recv_cb_called;
                      if (eval_b == 2) {
                        eval_a = 2;
                        eval_b = (int64_t)sv_send_cb_called;
                        if (eval_b == 2) {
                          eval_a = 2;
                          eval_b = (int64_t)close_cb_called;
                          if (eval_b == 2) {
                            uVar2 = uv_default_loop();
                            uv_walk(uVar2,close_walk_cb,0);
                            uv_run(uVar2,0);
                            eval_a = 0;
                            uVar2 = uv_default_loop();
                            iVar1 = uv_loop_close(uVar2);
                            eval_b = (int64_t)iVar1;
                            if (eval_b == 0) {
                              uv_library_shutdown();
                              return 0;
                            }
                            pcVar4 = "uv_loop_close(uv_default_loop())";
                            pcVar3 = "0";
                            uVar2 = 0xba;
                          }
                          else {
                            pcVar4 = "close_cb_called";
                            pcVar3 = "2";
                            uVar2 = 0xb8;
                          }
                        }
                        else {
                          pcVar4 = "sv_send_cb_called";
                          pcVar3 = "2";
                          uVar2 = 0xb7;
                        }
                      }
                      else {
                        pcVar4 = "cl_recv_cb_called";
                        pcVar3 = "2";
                        uVar2 = 0xb6;
                      }
                    }
                    else {
                      pcVar4 = "0";
                      pcVar3 = "sv_send_cb_called";
                      uVar2 = 0xb1;
                    }
                  }
                  else {
                    pcVar4 = "0";
                    pcVar3 = "cl_recv_cb_called";
                    uVar2 = 0xb0;
                  }
                }
                else {
                  pcVar4 = "0";
                  pcVar3 = "close_cb_called";
                  uVar2 = 0xaf;
                }
              }
              else {
                pcVar4 = "0";
                pcVar3 = "r";
                uVar2 = 0xad;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "r";
              uVar2 = 0xaa;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "r";
            uVar2 = 0xa3;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar2 = 0x9d;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0x99;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0x96;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_ip4_addr(\"0.0.0.0\", 9123, &addr)";
    uVar2 = 0x93;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(udp_multicast_join) {
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif
  int r;
  struct sockaddr_in addr;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  /* bind to the desired port */
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  /* join the multicast channel */
  r = uv_udp_set_membership(&server, MULTICAST_ADDR, NULL, UV_JOIN_GROUP);
  if (r == UV_ENODEV)
    RETURN_SKIP("No multicast support.");
  ASSERT_OK(r);
#if defined(__ANDROID__)
  /* It returns an ENOSYS error */
  RETURN_SKIP("Test does not currently work in ANDROID");
#endif

  r = uv_udp_recv_start(&server, alloc_cb, cl_recv_cb);
  ASSERT_OK(r);

  r = do_send(&req);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(cl_recv_cb_called);
  ASSERT_OK(sv_send_cb_called);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, cl_recv_cb_called);
  ASSERT_EQ(2, sv_send_cb_called);
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}